

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9PoPart2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_54;
  uint local_50;
  int fVerbose;
  int fSetLargest;
  int nOutsMax;
  int nOutsMin;
  int nDelta;
  int iStartNum;
  int c;
  Vec_Ptr_t *vPosEquivs;
  Gia_Man_t *pTemp;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  vPosEquivs = (Vec_Ptr_t *)0x0;
  _iStartNum = (Vec_Ptr_t *)0x0;
  nOutsMin = 0;
  nOutsMax = 10;
  fSetLargest = 100;
  fVerbose = 1000;
  local_50 = 0;
  local_54 = 0;
  pTemp = (Gia_Man_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
LAB_0027c784:
  do {
    iVar1 = Extra_UtilGetopt(argv_local._4_4_,&pTemp->pName,"SDLUmvh");
    if (iVar1 == -1) {
      if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9PoPart(): There is no AIG.\n");
        return 1;
      }
      vPosEquivs = (Vec_Ptr_t *)
                   Gia_ManFindPoPartition2
                             (pAStack_18->pGia,nOutsMin,nOutsMax,fSetLargest,fVerbose,local_50,
                              local_54,(Vec_Ptr_t **)&iStartNum);
      if ((Gia_Man_t *)vPosEquivs != (Gia_Man_t *)0x0) {
        Abc_FrameUpdateGia(pAStack_18,(Gia_Man_t *)vPosEquivs);
      }
      Abc_FrameReplacePoEquivs(pAStack_18,(Vec_Ptr_t **)&iStartNum);
      return 0;
    }
    switch(iVar1) {
    case 0x44:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_0027ca12;
      }
      nOutsMax = atoi((&pTemp->pName)[globalUtilOptind]);
      iVar1 = nOutsMax;
      break;
    default:
      goto LAB_0027ca12;
    case 0x4c:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_0027ca12;
      }
      fSetLargest = atoi((&pTemp->pName)[globalUtilOptind]);
      iVar1 = fSetLargest;
      break;
    case 0x53:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_0027ca12;
      }
      nOutsMin = atoi((&pTemp->pName)[globalUtilOptind]);
      iVar1 = nOutsMin;
      break;
    case 0x55:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-U\" should be followed by an integer.\n");
        goto LAB_0027ca12;
      }
      fVerbose = atoi((&pTemp->pName)[globalUtilOptind]);
      iVar1 = fVerbose;
      break;
    case 0x68:
      goto LAB_0027ca12;
    case 0x6d:
      local_50 = local_50 ^ 1;
      goto LAB_0027c784;
    case 0x76:
      local_54 = local_54 ^ 1;
      goto LAB_0027c784;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0027ca12:
      Abc_Print(-2,"usage: &popart2 [-SDLU num] [-mvh]\n");
      Abc_Print(-2,"\t         extracting multi-output sequential logic cones\n");
      Abc_Print(-2,"\t-S num : the index of the PO to start the cluster [default = %d]\n",
                (ulong)(uint)nOutsMin);
      Abc_Print(-2,"\t-D num : the max increase in flop count after adding one PO [default = %d]\n",
                (ulong)(uint)nOutsMax);
      Abc_Print(-2,"\t-L num : the minimum number of POs in a cluster [default = %d]\n",
                (ulong)(uint)fSetLargest);
      Abc_Print(-2,"\t-U num : the maximum number of POs in a cluster [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar2 = "no";
      if (local_50 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggle selecting the largest cluster [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_54 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9PoPart2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFindPoPartition2( Gia_Man_t * p, int iStartNum, int nDelta, int nOutsMin, int nOutsMax, int fSetLargest, int fVerbose, Vec_Ptr_t ** pvPosEquivs );
    Gia_Man_t * pTemp = NULL;
    Vec_Ptr_t * vPosEquivs = NULL;
    int c, iStartNum = 0, nDelta = 10, nOutsMin = 100, nOutsMax = 1000, fSetLargest = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SDLUmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            iStartNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iStartNum < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDelta < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutsMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutsMin < 0 )
                goto usage;
            break;
        case 'U':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-U\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutsMax < 0 )
                goto usage;
            break;
        case 'm':
            fSetLargest ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9PoPart(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManFindPoPartition2( pAbc->pGia, iStartNum, nDelta, nOutsMin, nOutsMax, fSetLargest, fVerbose, &vPosEquivs );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );
    return 0;

usage:
    Abc_Print( -2, "usage: &popart2 [-SDLU num] [-mvh]\n" );
    Abc_Print( -2, "\t         extracting multi-output sequential logic cones\n" );
    Abc_Print( -2, "\t-S num : the index of the PO to start the cluster [default = %d]\n", iStartNum );
    Abc_Print( -2, "\t-D num : the max increase in flop count after adding one PO [default = %d]\n", nDelta );
    Abc_Print( -2, "\t-L num : the minimum number of POs in a cluster [default = %d]\n", nOutsMin );
    Abc_Print( -2, "\t-U num : the maximum number of POs in a cluster [default = %d]\n", nOutsMax );
    Abc_Print( -2, "\t-m     : toggle selecting the largest cluster [default = %s]\n", fSetLargest? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}